

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O0

int ssyrk_(char *uplo,char *trans,integer *n,integer *k,real *alpha,real *a,integer *lda,real *beta,
          real *c__,integer *ldc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  integer iVar6;
  int iVar7;
  int iVar8;
  logical lVar9;
  long lVar10;
  int local_6c;
  int local_64;
  integer i__3;
  integer i__2;
  integer i__1;
  integer c_offset;
  integer c_dim1;
  integer a_offset;
  integer a_dim1;
  real *a_local;
  real *alpha_local;
  integer *k_local;
  integer *n_local;
  char *trans_local;
  char *uplo_local;
  
  iVar1 = *lda;
  iVar7 = iVar1 + 1;
  iVar2 = *ldc;
  iVar8 = iVar2 + 1;
  lVar9 = lsame_(trans,"N");
  if (lVar9 == 0) {
    ssyrk_::nrowa = *k;
  }
  else {
    ssyrk_::nrowa = *n;
  }
  ssyrk_::upper = lsame_(uplo,"U");
  ssyrk_::info = 0;
  if ((ssyrk_::upper == 0) && (lVar9 = lsame_(uplo,"L"), lVar9 == 0)) {
    ssyrk_::info = 1;
  }
  else {
    lVar9 = lsame_(trans,"N");
    if ((lVar9 == 0) &&
       ((lVar9 = lsame_(trans,"T"), lVar9 == 0 && (lVar9 = lsame_(trans,"C"), lVar9 == 0)))) {
      ssyrk_::info = 2;
    }
    else if (*n < 0) {
      ssyrk_::info = 3;
    }
    else if (*k < 0) {
      ssyrk_::info = 4;
    }
    else {
      if (ssyrk_::nrowa < 2) {
        local_64 = 1;
      }
      else {
        local_64 = ssyrk_::nrowa;
      }
      if (*lda < local_64) {
        ssyrk_::info = 7;
      }
      else {
        if (*n < 2) {
          local_6c = 1;
        }
        else {
          local_6c = *n;
        }
        if (*ldc < local_6c) {
          ssyrk_::info = 10;
        }
      }
    }
  }
  if (ssyrk_::info == 0) {
    if ((*n != 0) &&
       ((((*alpha != 0.0 || (NAN(*alpha))) && (*k != 0)) || ((*beta != 1.0 || (NAN(*beta))))))) {
      if ((*alpha != 0.0) || (NAN(*alpha))) {
        lVar9 = lsame_(trans,"N");
        if (lVar9 == 0) {
          if (ssyrk_::upper == 0) {
            iVar3 = *n;
            for (ssyrk_::j = 1; ssyrk_::j <= iVar3; ssyrk_::j = ssyrk_::j + 1) {
              iVar4 = *n;
              for (ssyrk_::i__ = ssyrk_::j; ssyrk_::i__ <= iVar4; ssyrk_::i__ = ssyrk_::i__ + 1) {
                ssyrk_::temp = 0.0;
                for (ssyrk_::l = 1; ssyrk_::l <= *k; ssyrk_::l = ssyrk_::l + 1) {
                  ssyrk_::temp = a[(long)(ssyrk_::l + ssyrk_::i__ * iVar1) - (long)iVar7] *
                                 a[(long)(ssyrk_::l + ssyrk_::j * iVar1) - (long)iVar7] +
                                 ssyrk_::temp;
                }
                if ((*beta != 0.0) || (NAN(*beta))) {
                  c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8] =
                       *alpha * ssyrk_::temp +
                       *beta * c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8];
                }
                else {
                  c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8] = *alpha * ssyrk_::temp
                  ;
                }
              }
            }
          }
          else {
            iVar3 = *n;
            for (ssyrk_::j = 1; iVar6 = ssyrk_::j, ssyrk_::j <= iVar3; ssyrk_::j = ssyrk_::j + 1) {
              for (ssyrk_::i__ = 1; ssyrk_::i__ <= iVar6; ssyrk_::i__ = ssyrk_::i__ + 1) {
                ssyrk_::temp = 0.0;
                for (ssyrk_::l = 1; ssyrk_::l <= *k; ssyrk_::l = ssyrk_::l + 1) {
                  ssyrk_::temp = a[(long)(ssyrk_::l + ssyrk_::i__ * iVar1) - (long)iVar7] *
                                 a[(long)(ssyrk_::l + ssyrk_::j * iVar1) - (long)iVar7] +
                                 ssyrk_::temp;
                }
                if ((*beta != 0.0) || (NAN(*beta))) {
                  c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8] =
                       *alpha * ssyrk_::temp +
                       *beta * c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8];
                }
                else {
                  c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8] = *alpha * ssyrk_::temp
                  ;
                }
              }
            }
          }
        }
        else if (ssyrk_::upper == 0) {
          iVar3 = *n;
          for (ssyrk_::j = 1; ssyrk_::j <= iVar3; ssyrk_::j = ssyrk_::j + 1) {
            if ((*beta != 0.0) || (NAN(*beta))) {
              if ((*beta != 1.0) || (NAN(*beta))) {
                iVar4 = *n;
                for (ssyrk_::i__ = ssyrk_::j; ssyrk_::i__ <= iVar4; ssyrk_::i__ = ssyrk_::i__ + 1) {
                  c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8] =
                       *beta * c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8];
                }
              }
            }
            else {
              iVar4 = *n;
              for (ssyrk_::i__ = ssyrk_::j; ssyrk_::i__ <= iVar4; ssyrk_::i__ = ssyrk_::i__ + 1) {
                c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8] = 0.0;
              }
            }
            iVar4 = *k;
            for (ssyrk_::l = 1; ssyrk_::l <= iVar4; ssyrk_::l = ssyrk_::l + 1) {
              if ((a[(long)(ssyrk_::j + ssyrk_::l * iVar1) - (long)iVar7] != 0.0) ||
                 (NAN(a[(long)(ssyrk_::j + ssyrk_::l * iVar1) - (long)iVar7]))) {
                ssyrk_::temp = *alpha * a[(long)(ssyrk_::j + ssyrk_::l * iVar1) - (long)iVar7];
                iVar5 = *n;
                for (ssyrk_::i__ = ssyrk_::j; ssyrk_::i__ <= iVar5; ssyrk_::i__ = ssyrk_::i__ + 1) {
                  lVar10 = (long)(ssyrk_::i__ + ssyrk_::j * iVar2);
                  c__[lVar10 - iVar8] =
                       ssyrk_::temp * a[(long)(ssyrk_::i__ + ssyrk_::l * iVar1) - (long)iVar7] +
                       c__[lVar10 - iVar8];
                }
              }
            }
          }
        }
        else {
          iVar3 = *n;
          for (ssyrk_::j = 1; iVar6 = ssyrk_::j, ssyrk_::j <= iVar3; ssyrk_::j = ssyrk_::j + 1) {
            if ((*beta != 0.0) || (NAN(*beta))) {
              if ((*beta != 1.0) || (NAN(*beta))) {
                for (ssyrk_::i__ = 1; ssyrk_::i__ <= iVar6; ssyrk_::i__ = ssyrk_::i__ + 1) {
                  c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8] =
                       *beta * c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8];
                }
              }
            }
            else {
              for (ssyrk_::i__ = 1; ssyrk_::i__ <= iVar6; ssyrk_::i__ = ssyrk_::i__ + 1) {
                c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8] = 0.0;
              }
            }
            iVar4 = *k;
            for (ssyrk_::l = 1; iVar6 = ssyrk_::j, ssyrk_::l <= iVar4; ssyrk_::l = ssyrk_::l + 1) {
              if ((a[(long)(ssyrk_::j + ssyrk_::l * iVar1) - (long)iVar7] != 0.0) ||
                 (NAN(a[(long)(ssyrk_::j + ssyrk_::l * iVar1) - (long)iVar7]))) {
                ssyrk_::temp = *alpha * a[(long)(ssyrk_::j + ssyrk_::l * iVar1) - (long)iVar7];
                for (ssyrk_::i__ = 1; ssyrk_::i__ <= iVar6; ssyrk_::i__ = ssyrk_::i__ + 1) {
                  lVar10 = (long)(ssyrk_::i__ + ssyrk_::j * iVar2);
                  c__[lVar10 - iVar8] =
                       ssyrk_::temp * a[(long)(ssyrk_::i__ + ssyrk_::l * iVar1) - (long)iVar7] +
                       c__[lVar10 - iVar8];
                }
              }
            }
          }
        }
      }
      else if (ssyrk_::upper == 0) {
        if ((*beta != 0.0) || (NAN(*beta))) {
          iVar1 = *n;
          for (ssyrk_::j = 1; ssyrk_::j <= iVar1; ssyrk_::j = ssyrk_::j + 1) {
            iVar7 = *n;
            for (ssyrk_::i__ = ssyrk_::j; ssyrk_::i__ <= iVar7; ssyrk_::i__ = ssyrk_::i__ + 1) {
              c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8] =
                   *beta * c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8];
            }
          }
        }
        else {
          iVar1 = *n;
          for (ssyrk_::j = 1; ssyrk_::j <= iVar1; ssyrk_::j = ssyrk_::j + 1) {
            iVar7 = *n;
            for (ssyrk_::i__ = ssyrk_::j; ssyrk_::i__ <= iVar7; ssyrk_::i__ = ssyrk_::i__ + 1) {
              c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8] = 0.0;
            }
          }
        }
      }
      else if ((*beta != 0.0) || (NAN(*beta))) {
        iVar1 = *n;
        for (ssyrk_::j = 1; iVar6 = ssyrk_::j, ssyrk_::j <= iVar1; ssyrk_::j = ssyrk_::j + 1) {
          for (ssyrk_::i__ = 1; ssyrk_::i__ <= iVar6; ssyrk_::i__ = ssyrk_::i__ + 1) {
            c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8] =
                 *beta * c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8];
          }
        }
      }
      else {
        iVar1 = *n;
        for (ssyrk_::j = 1; iVar6 = ssyrk_::j, ssyrk_::j <= iVar1; ssyrk_::j = ssyrk_::j + 1) {
          for (ssyrk_::i__ = 1; ssyrk_::i__ <= iVar6; ssyrk_::i__ = ssyrk_::i__ + 1) {
            c__[(long)(ssyrk_::i__ + ssyrk_::j * iVar2) - (long)iVar8] = 0.0;
          }
        }
      }
    }
  }
  else {
    xerbla_("SSYRK ",&ssyrk_::info);
  }
  return 0;
}

Assistant:

int ssyrk_(char *uplo, char *trans, integer *n, integer *k,
	real *alpha, real *a, integer *lda, real *beta, real *c__, integer *
	ldc)
{
    /* System generated locals */
    integer a_dim1, a_offset, c_dim1, c_offset, i__1, i__2, i__3;

    /* Local variables */
    static integer i__, j, l, info;
    static real temp;
    extern logical lsame_(char *, char *);
    static integer nrowa;
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    Purpose
    =======

    SSYRK  performs one of the symmetric rank k operations

       C := alpha*A*A' + beta*C,

    or

       C := alpha*A'*A + beta*C,

    where  alpha and beta  are scalars, C is an  n by n  symmetric matrix
    and  A  is an  n by k  matrix in the first case and a  k by n  matrix
    in the second case.

    Parameters
    ==========

    UPLO   - CHARACTER*1.
             On  entry,   UPLO  specifies  whether  the  upper  or  lower
             triangular  part  of the  array  C  is to be  referenced  as
             follows:

                UPLO = 'U' or 'u'   Only the  upper triangular part of  C
                                    is to be referenced.

                UPLO = 'L' or 'l'   Only the  lower triangular part of  C
                                    is to be referenced.

             Unchanged on exit.

    TRANS  - CHARACTER*1.
             On entry,  TRANS  specifies the operation to be performed as
             follows:

                TRANS = 'N' or 'n'   C := alpha*A*A' + beta*C.

                TRANS = 'T' or 't'   C := alpha*A'*A + beta*C.

                TRANS = 'C' or 'c'   C := alpha*A'*A + beta*C.

             Unchanged on exit.

    N      - INTEGER.
             On entry,  N specifies the order of the matrix C.  N must be
             at least zero.
             Unchanged on exit.

    K      - INTEGER.
             On entry with  TRANS = 'N' or 'n',  K  specifies  the number
             of  columns   of  the   matrix   A,   and  on   entry   with
             TRANS = 'T' or 't' or 'C' or 'c',  K  specifies  the  number
             of rows of the matrix  A.  K must be at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry, ALPHA specifies the scalar alpha.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, ka ), where ka is
             k  when  TRANS = 'N' or 'n',  and is  n  otherwise.
             Before entry with  TRANS = 'N' or 'n',  the  leading  n by k
             part of the array  A  must contain the matrix  A,  otherwise
             the leading  k by n  part of the array  A  must contain  the
             matrix A.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in  the  calling  (sub)  program.   When  TRANS = 'N' or 'n'
             then  LDA must be at least  max( 1, n ), otherwise  LDA must
             be at least  max( 1, k ).
             Unchanged on exit.

    BETA   - REAL            .
             On entry, BETA specifies the scalar beta.
             Unchanged on exit.

    C      - REAL             array of DIMENSION ( LDC, n ).
             Before entry  with  UPLO = 'U' or 'u',  the leading  n by n
             upper triangular part of the array C must contain the upper
             triangular part  of the  symmetric matrix  and the strictly
             lower triangular part of C is not referenced.  On exit, the
             upper triangular part of the array  C is overwritten by the
             upper triangular part of the updated matrix.
             Before entry  with  UPLO = 'L' or 'l',  the leading  n by n
             lower triangular part of the array C must contain the lower
             triangular part  of the  symmetric matrix  and the strictly
             upper triangular part of C is not referenced.  On exit, the
             lower triangular part of the array  C is overwritten by the
             lower triangular part of the updated matrix.

    LDC    - INTEGER.
             On entry, LDC specifies the first dimension of C as declared
             in  the  calling  (sub)  program.   LDC  must  be  at  least
             max( 1, n ).
             Unchanged on exit.


    Level 3 Blas routine.

    -- Written on 8-February-1989.
       Jack Dongarra, Argonne National Laboratory.
       Iain Duff, AERE Harwell.
       Jeremy Du Croz, Numerical Algorithms Group Ltd.
       Sven Hammarling, Numerical Algorithms Group Ltd.


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    c_dim1 = *ldc;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;

    /* Function Body */
    if (lsame_(trans, "N")) {
	nrowa = *n;
    } else {
	nrowa = *k;
    }
    upper = lsame_(uplo, "U");

    info = 0;
    if (! upper && ! lsame_(uplo, "L")) {
	info = 1;
    } else if (! lsame_(trans, "N") && ! lsame_(trans,
	    "T") && ! lsame_(trans, "C")) {
	info = 2;
    } else if (*n < 0) {
	info = 3;
    } else if (*k < 0) {
	info = 4;
    } else if (*lda < max(1,nrowa)) {
	info = 7;
    } else if (*ldc < max(1,*n)) {
	info = 10;
    }
    if (info != 0) {
	xerbla_("SSYRK ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*n == 0 || ((*alpha == 0.f || *k == 0) && *beta == 1.f)) {
	return 0;
    }

/*     And when  alpha.eq.zero. */

    if (*alpha == 0.f) {
	if (upper) {
	    if (*beta == 0.f) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L10: */
		    }
/* L20: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L30: */
		    }
/* L40: */
		}
	    }
	} else {
	    if (*beta == 0.f) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L50: */
		    }
/* L60: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L70: */
		    }
/* L80: */
		}
	    }
	}
	return 0;
    }

/*     Start the operations. */

    if (lsame_(trans, "N")) {

/*        Form  C := alpha*A*A' + beta*C. */

	if (upper) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (*beta == 0.f) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L90: */
		    }
		} else if (*beta != 1.f) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L100: */
		    }
		}
		i__2 = *k;
		for (l = 1; l <= i__2; ++l) {
		    if (a[j + l * a_dim1] != 0.f) {
			temp = *alpha * a[j + l * a_dim1];
			i__3 = j;
			for (i__ = 1; i__ <= i__3; ++i__) {
			    c__[i__ + j * c_dim1] += temp * a[i__ + l *
				    a_dim1];
/* L110: */
			}
		    }
/* L120: */
		}
/* L130: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (*beta == 0.f) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L140: */
		    }
		} else if (*beta != 1.f) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L150: */
		    }
		}
		i__2 = *k;
		for (l = 1; l <= i__2; ++l) {
		    if (a[j + l * a_dim1] != 0.f) {
			temp = *alpha * a[j + l * a_dim1];
			i__3 = *n;
			for (i__ = j; i__ <= i__3; ++i__) {
			    c__[i__ + j * c_dim1] += temp * a[i__ + l *
				    a_dim1];
/* L160: */
			}
		    }
/* L170: */
		}
/* L180: */
	    }
	}
    } else {

/*        Form  C := alpha*A'*A + beta*C. */

	if (upper) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = j;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    temp = 0.f;
		    i__3 = *k;
		    for (l = 1; l <= i__3; ++l) {
			temp += a[l + i__ * a_dim1] * a[l + j * a_dim1];
/* L190: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = *alpha * temp;
		    } else {
			c__[i__ + j * c_dim1] = *alpha * temp + *beta * c__[
				i__ + j * c_dim1];
		    }
/* L200: */
		}
/* L210: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *n;
		for (i__ = j; i__ <= i__2; ++i__) {
		    temp = 0.f;
		    i__3 = *k;
		    for (l = 1; l <= i__3; ++l) {
			temp += a[l + i__ * a_dim1] * a[l + j * a_dim1];
/* L220: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = *alpha * temp;
		    } else {
			c__[i__ + j * c_dim1] = *alpha * temp + *beta * c__[
				i__ + j * c_dim1];
		    }
/* L230: */
		}
/* L240: */
	    }
	}
    }

    return 0;

/*     End of SSYRK . */

}